

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_CutParams(Of_Man_t *p,Of_Cut_t *pCut,int nGiaRefs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = *(uint *)&pCut->field_0x10;
  uVar5 = uVar1 >> 0x1b;
  if ((int)uVar5 <= p->pPars->nLutSize) {
    pCut->Delay = 0;
    pCut->Flow = 0;
    iVar3 = 0;
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      iVar3 = pCut->Delay;
      iVar2 = Vec_IntEntry(&p->vCutDelays,pCut->pLeaves[uVar4]);
      if (iVar2 < iVar3) {
        iVar2 = iVar3;
      }
      pCut->Delay = iVar2;
      iVar3 = Vec_IntEntry(&p->vCutFlows,pCut->pLeaves[uVar4]);
      iVar3 = iVar3 + pCut->Flow;
      pCut->Flow = iVar3;
    }
    pCut->Delay = (pCut->Delay + 1) - (uint)(uVar1 < 0x10000000);
    iVar2 = 0;
    if (0xfffffff < uVar1) {
      iVar2 = (uVar5 + p->pPars->nAreaTuner) * 100;
    }
    pCut->Flow = (iVar2 + iVar3) / (int)(nGiaRefs + (uint)(nGiaRefs == 0));
    return;
  }
  __assert_fail("nLeaves <= p->pPars->nLutSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                ,0x2a0,"void Of_CutParams(Of_Man_t *, Of_Cut_t *, int)");
}

Assistant:

static inline void Of_CutParams( Of_Man_t * p, Of_Cut_t * pCut, int nGiaRefs )
{
    int i, nLeaves = pCut->nLeaves; 
    assert( nLeaves <= p->pPars->nLutSize );
    pCut->Delay = 0;
    pCut->Flow  = 0;
    for ( i = 0; i < nLeaves; i++ )
    {
        pCut->Delay = Abc_MaxInt( pCut->Delay, Of_ObjCutDelay(p, pCut->pLeaves[i]) );
        pCut->Flow += Of_ObjCutFlow(p, pCut->pLeaves[i]);
    }
    pCut->Delay += (int)(nLeaves > 1);
    pCut->Flow = (pCut->Flow + 100 * Of_CutArea(p, nLeaves)) / (nGiaRefs ? nGiaRefs : 1);
}